

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O2

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  cmdline_parser_arg_type arg_type;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  custom_getopt_data *pcVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  char *value;
  char *pcVar11;
  double *pdVar12;
  char **ppcVar13;
  uint *puVar14;
  custom_getopt_data *extraout_RDX;
  custom_getopt_data *extraout_RDX_00;
  custom_getopt_data *extraout_RDX_01;
  custom_getopt_data *extraout_RDX_02;
  custom_getopt_data *extraout_RDX_03;
  custom_getopt_data *extraout_RDX_04;
  custom_getopt_data *pcVar15;
  uint *puVar16;
  custom_getopt_data *extraout_RDX_05;
  custom_getopt_data *extraout_RDX_06;
  custom_getopt_data *extraout_RDX_07;
  custom_getopt_data *extraout_RDX_08;
  custom_getopt_data *extraout_RDX_09;
  option *poVar17;
  option *poVar18;
  uint uVar19;
  size_t sVar20;
  uint uVar22;
  char *pcVar23;
  uint uVar24;
  char **possible_values;
  uint uVar25;
  option *poVar26;
  char cVar27;
  char *pcVar28;
  int iVar29;
  custom_getopt_data *pcVar30;
  bool bVar31;
  char cVar32;
  undefined4 in_stack_fffffffffffffdb8;
  int local_240;
  int local_23c;
  uint local_238;
  double *local_230;
  gengetopt_args_info local_args_info;
  ulong uVar21;
  
  package_name = *argv;
  iVar6 = params->override;
  iVar1 = params->check_required;
  arg_type = params->check_ambiguity;
  pcVar23 = (char *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  local_240 = params->print_errors;
  pcVar7 = (custom_getopt_data *)(ulong)(uint)argc;
  local_230 = (double *)0x0;
  pcVar28 = (char *)0x0;
  pcVar30 = (custom_getopt_data *)0x0;
  pcVar15 = extraout_RDX;
  uVar24 = argc;
LAB_001299ac:
  do {
    custom_opterr = local_240;
    uVar19 = (uint)pcVar30;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19;
    if (argc < 1) {
      local_230 = (double *)0x0;
      argc = uVar24;
      goto LAB_0012a1b1;
    }
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
    custom_optarg = pcVar28;
    if ((uVar19 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (uVar19 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_00129a3d:
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        exchange(argv,(custom_getopt_data *)pcVar23);
      }
      pcVar30 = (custom_getopt_data *)
                (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
      if (argc < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      pcVar15 = pcVar7;
      if ((long)pcVar7 < (long)pcVar30) {
        pcVar15 = pcVar30;
      }
      for (; uVar19 = (uint)pcVar30, (long)pcVar30 < (long)pcVar7;
          pcVar30 = (custom_getopt_data *)((long)&pcVar30->custom_optind + 1)) {
        if ((*argv[(long)pcVar30] == '-') && (argv[(long)pcVar30][1] != '\0')) {
          pcVar15 = (custom_getopt_data *)((ulong)pcVar30 & 0xffffffff);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar19;
          break;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar19 + 1;
      }
      uVar25 = argc;
      if ((((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) ||
           (pcVar23 = argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7],
           uVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, *pcVar23 != '-')) ||
          (pcVar23[1] != '-')) || (pcVar23[2] != '\0')) {
        uVar22 = (uint)pcVar15;
        bVar31 = uVar22 != argc;
        argc = uVar25;
        uVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        uVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        uVar3 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
        if (bVar31) {
          lVar8 = (long)(int)uVar22;
          pcVar23 = argv[lVar8];
          if ((*pcVar23 != '-') || (pcVar23[1] == '\0')) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar22 + 1;
            uVar21 = 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
            goto LAB_0012a570;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               pcVar23 + (ulong)(pcVar23[1] == '-') + 1;
          goto LAB_00129b3f;
        }
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
        uVar19 = argc;
        uVar25 = argc;
        uVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        uVar3 = argc;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          exchange(argv,pcVar15);
          pcVar7 = extraout_RDX_09;
          uVar2 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar3;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar2;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar25;
      bVar31 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != argc;
      pcVar15 = pcVar7;
      argc = uVar24;
      if (bVar31) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        uVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      goto LAB_0012a1b1;
    }
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
       (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_00129a3d;
    lVar8 = (long)(int)uVar19;
    pcVar15 = (custom_getopt_data *)((ulong)pcVar30 & 0xffffffff);
LAB_00129b3f:
    pcVar28 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    pcVar23 = argv[lVar8];
    local_238 = (uint)pcVar15;
    if (pcVar23[1] == '-') {
      for (sVar20 = 0;
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar20] != '\0' &&
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar20] != '='));
          sVar20 = sVar20 + 1) {
      }
      bVar31 = false;
      local_23c = -1;
      iVar29 = 0;
      poVar17 = (option *)0x0;
      for (poVar26 = cmdline_parser_internal::long_options; pcVar11 = poVar26->name,
          pcVar11 != (char *)0x0; poVar26 = poVar26 + 1) {
        iVar5 = strncmp(pcVar11,pcVar28,sVar20);
        poVar18 = poVar17;
        iVar4 = local_23c;
        if (iVar5 == 0) {
          sVar10 = strlen(pcVar11);
          if ((int)sVar10 == (int)sVar20) goto LAB_00129cb3;
          poVar18 = poVar26;
          iVar4 = iVar29;
          if ((poVar17 != (option *)0x0) &&
             (((poVar17->has_arg != poVar26->has_arg || (poVar17->flag != poVar26->flag)) ||
              (poVar18 = poVar17, iVar4 = local_23c, poVar17->val != poVar26->val)))) {
            bVar31 = true;
            poVar18 = poVar17;
            iVar4 = local_23c;
          }
        }
        local_23c = iVar4;
        iVar29 = iVar29 + 1;
        poVar17 = poVar18;
      }
      if (bVar31) {
        if (local_240 != 0) {
          fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar23);
          pcVar28 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          local_238 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        sVar20 = strlen(pcVar28);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar28 + sVar20;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
      }
      else {
        poVar26 = poVar17;
        iVar29 = local_23c;
        if (poVar17 != (option *)0x0) {
LAB_00129cb3:
          local_23c = iVar29;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
          pcVar30 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          if (pcVar28[sVar20] == '\0') {
            if (poVar26->has_arg == 1) {
              if ((int)uVar24 <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                if (local_240 != 0) {
                  fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar23);
                  pcVar28 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                }
                sVar20 = strlen(pcVar28);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar28 + sVar20;
                goto LAB_0012a40b;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
              pcVar30 = (custom_getopt_data *)(ulong)(local_238 + 2);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 2;
            }
          }
          else {
            if (poVar26->has_arg == 0) {
              if (local_240 != 0) {
                if (pcVar23[1] == '-') {
                  fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                          poVar26->name);
                }
                else {
                  fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                          (ulong)(uint)(int)*pcVar23,poVar26->name);
                }
              }
              pcVar23 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              sVar20 = strlen(_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar23 + sVar20;
              goto LAB_0012a40b;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar28 + sVar20 + 1;
          }
          cVar32 = '\"';
          argc = uVar24;
          sVar20 = strlen(pcVar28);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar28 + sVar20;
          uVar21 = (ulong)(uint)poVar26->val;
          pcVar15 = extraout_RDX_01;
          if ((uint *)poVar26->flag == (uint *)0x0) goto LAB_00129db5;
          *poVar26->flag = poVar26->val;
          pcVar30 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          local_240 = custom_opterr;
          goto LAB_00129e11;
        }
        if (local_240 != 0) {
          fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar28);
          local_238 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
      }
LAB_0012a40b:
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      goto LAB_0012a419;
    }
    pcVar23 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
    cVar27 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    uVar19 = (uint)cVar27;
    uVar21 = (ulong)uVar19;
    cVar32 = -0x69;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar23;
    pvVar9 = memchr("hVo:l:",uVar19,7);
    if (pcVar28[1] == '\0') {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
      pcVar30 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      local_238 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if ((pvVar9 == (void *)0x0) || (cVar27 == ':')) {
      if (local_240 != 0) {
        fprintf(_stderr,"%s: invalid option -- %c\n",*argv,uVar21);
      }
      goto LAB_0012a40b;
    }
    pcVar15 = extraout_RDX_00;
    argc = uVar24;
    if (*(char *)((long)pvVar9 + 1) == ':') {
      if (*(char *)((long)pvVar9 + 2) == ':') {
        if (*pcVar23 == '\0') {
          pcVar23 = (char *)0x0;
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
          pcVar30 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        local_23c = 0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
      }
      else {
        if (*pcVar23 == '\0') {
          if (local_238 != uVar24) {
            pcVar23 = argv[(int)local_238];
            goto LAB_0012a0a0;
          }
          cVar27 = '?';
          if (local_240 == 0) {
            local_240 = 0;
          }
          else {
            cVar32 = '.';
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar19);
            pcVar30 = (custom_getopt_data *)
                      (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            local_240 = custom_opterr;
            pcVar15 = extraout_RDX_06;
          }
        }
        else {
LAB_0012a0a0:
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar23;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_238 + 1;
          pcVar30 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        local_23c = 0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        uVar21 = (ulong)(uint)(int)cVar27;
        argc = uVar24;
      }
    }
    else {
      local_23c = 0;
    }
LAB_00129db5:
    pcVar28 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    uVar19 = (uint)pcVar30;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar29 = (int)uVar21;
    if (iVar29 == 0) {
LAB_00129e11:
      pcVar28 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      pcVar11 = cmdline_parser_internal::long_options[local_23c].name;
      cVar32 = '0';
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
      iVar29 = strcmp(pcVar11,"density");
      if (iVar29 == 0) {
        iVar29 = 0x23e7f7;
        pcVar11 = (char *)0x3;
        puVar14 = &local_args_info.density_given;
        puVar16 = &args_info->density_given;
        pcVar23 = (char *)&args_info->density_orig;
        pdVar12 = &args_info->density_arg;
      }
      else {
        if (*pcVar11 != 'n') {
LAB_00129e80:
          pcVar23 = "molFraction";
          iVar29 = strcmp(pcVar11,"molFraction");
          pcVar15 = extraout_RDX_02;
          uVar24 = argc;
          if (iVar29 == 0) {
            value = get_multiple_arg_token(pcVar28);
            pcVar11 = pcVar28;
            while( true ) {
              pcVar11 = get_multiple_arg_token_next(pcVar11);
              cVar32 = -0x41;
              pdVar12 = (double *)malloc(0x18);
              pdVar12[2] = (double)local_230;
              *pdVar12 = 0.0;
              pdVar12[1] = 0.0;
              pcVar23 = (char *)(pdVar12 + 1);
              iVar29 = update_arg(pdVar12,(char **)pcVar23,(uint *)0x0,
                                  &local_args_info.molFraction_given,value,(char **)0x0,(char *)0x3,
                                  ARG_NO,1,1,1,0x23e808,(char *)0x2d,cVar32,
                                  (char *)CONCAT44(argc,in_stack_fffffffffffffdb8));
              local_230 = pdVar12;
              if (iVar29 != 0) {
                free(value);
                goto LAB_0012a43d;
              }
              pcVar15 = extraout_RDX_03;
              uVar24 = argc;
              if (pcVar11 == (char *)0x0) break;
              value = get_multiple_arg_token(pcVar11);
            }
          }
          goto LAB_001299ac;
        }
        if ((pcVar11[1] == 'x') && (pcVar11[2] == '\0')) {
          iVar29 = 0x23e7ff;
          puVar14 = &local_args_info.nx_given;
          puVar16 = &args_info->nx_given;
          pcVar23 = (char *)&args_info->nx_orig;
          pdVar12 = (double *)&args_info->nx_arg;
        }
        else if ((pcVar11[1] == 'y') && (pcVar11[2] == '\0')) {
          iVar29 = 0x23e802;
          puVar14 = &local_args_info.ny_given;
          puVar16 = &args_info->ny_given;
          pcVar23 = (char *)&args_info->ny_orig;
          pdVar12 = (double *)&args_info->ny_arg;
        }
        else {
          if ((pcVar11[1] != 'z') || (pcVar11[2] != '\0')) goto LAB_00129e80;
          iVar29 = 0x23e805;
          puVar14 = &local_args_info.nz_given;
          puVar16 = &args_info->nz_given;
          pcVar23 = (char *)&args_info->nz_orig;
          pdVar12 = (double *)&args_info->nz_arg;
        }
        pcVar11 = (char *)0x2;
      }
      iVar29 = update_arg(pdVar12,(char **)pcVar23,puVar16,puVar14,pcVar28,(char **)0x0,pcVar11,
                          arg_type,iVar6,0,0,iVar29,(char *)0x2d,cVar32,
                          (char *)CONCAT44(argc,in_stack_fffffffffffffdb8));
      pcVar15 = extraout_RDX_05;
      uVar24 = argc;
      uVar19 = argc;
    }
    else {
      if (iVar29 == 0x6c) {
        possible_values = cmdline_parser_lattice_values;
        pcVar11 = (char *)0x6c;
        iVar29 = 0x23e814;
        puVar14 = &local_args_info.lattice_given;
        puVar16 = &args_info->lattice_given;
        pcVar23 = (char *)&args_info->lattice_orig;
        ppcVar13 = &args_info->lattice_arg;
      }
      else {
        if (iVar29 != 0x6f) {
          if (iVar29 == -1) {
LAB_0012a1b1:
            uVar25 = local_args_info.molFraction_given;
            uVar24 = args_info->molFraction_given;
            custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
            if (local_230 != (double *)0x0 && local_args_info.molFraction_given != 0) {
              sVar20 = (ulong)(local_args_info.molFraction_given + uVar24) << 3;
              ppcVar13 = (char **)realloc(args_info->molFraction_orig,sVar20);
              args_info->molFraction_orig = ppcVar13;
              pdVar12 = (double *)realloc(args_info->molFraction_arg,sVar20);
              args_info->molFraction_arg = pdVar12;
              pcVar15 = extraout_RDX_07;
              while (uVar25 = uVar25 - 1, -1 < (int)uVar25) {
                args_info->molFraction_arg[uVar24 + uVar25] = *local_230;
                args_info->molFraction_orig[uVar24 + uVar25] = (char *)local_230[1];
                pdVar12 = (double *)local_230[2];
                free(local_230);
                pcVar15 = extraout_RDX_08;
                local_230 = pdVar12;
              }
              uVar24 = args_info->molFraction_given;
            }
            args_info->molFraction_given = uVar24 + local_args_info.molFraction_given;
            local_args_info.molFraction_given = 0;
            if (iVar1 == 0) {
              cmdline_parser_release(&local_args_info);
            }
            else {
              iVar6 = cmdline_parser_required2(args_info,*argv,(char *)pcVar15);
              cmdline_parser_release(&local_args_info);
              if (iVar6 != 0) {
                return 1;
              }
            }
            uVar24 = argc - uVar19;
            if (uVar24 != 0 && (int)uVar19 <= argc) {
              args_info->inputs_num = uVar24;
              ppcVar13 = (char **)malloc((ulong)uVar24 << 3);
              args_info->inputs = ppcVar13;
              for (lVar8 = 0; (int)uVar19 + lVar8 < (long)argc; lVar8 = lVar8 + 1) {
                pcVar23 = gengetopt_strdup(argv[(int)uVar19 + lVar8]);
                args_info->inputs[lVar8] = pcVar23;
              }
              return 0;
            }
            return 0;
          }
          if (iVar29 != 0x3f) {
            if (iVar29 == 0x56) {
              cmdline_parser_print_version();
            }
            else {
              if (iVar29 != 0x68) {
LAB_0012a570:
                custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
                fprintf(_stderr,"%s: option unknown: %c%s\n","randomBuilder",uVar21,"");
                abort();
              }
              cmdline_parser_print_help();
            }
            cmdline_parser_free(&local_args_info);
            exit(0);
          }
          goto LAB_0012a419;
        }
        possible_values = (char **)0x0;
        pcVar11 = (char *)0x6f;
        iVar29 = 0x23e7f0;
        puVar14 = &local_args_info.output_given;
        puVar16 = &args_info->output_given;
        pcVar23 = (char *)&args_info->output_orig;
        ppcVar13 = &args_info->output_arg;
      }
      iVar29 = update_arg(ppcVar13,(char **)pcVar23,puVar16,puVar14,
                          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,possible_values,
                          (char *)0x1,arg_type,iVar6,0,0,iVar29,pcVar11,cVar32,
                          (char *)CONCAT44(argc,in_stack_fffffffffffffdb8));
      pcVar15 = extraout_RDX_04;
      uVar19 = argc;
    }
    argc = uVar24;
    uVar24 = uVar19;
    if (iVar29 != 0) {
LAB_0012a419:
      if (local_230 != (double *)0x0) {
LAB_0012a43d:
        while (local_230 != (double *)0x0) {
          free((void *)local_230[1]);
          pdVar12 = (double *)local_230[2];
          free(local_230);
          local_230 = pdVar12;
        }
      }
      cmdline_parser_release(&local_args_info);
      return 1;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "density",	1, NULL, 0 },
        { "nx",	1, NULL, 0 },
        { "ny",	1, NULL, 0 },
        { "nz",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "lattice",	1, NULL, 'l' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:l:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'l':	/* Lattice Type.  */
        
        
          if (update_arg( (void *)&(args_info->lattice_arg), 
               &(args_info->lattice_orig), &(args_info->lattice_given),
              &(local_args_info.lattice_given), optarg, cmdline_parser_lattice_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "lattice", 'l',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* density (g/cm^3).  */
          if (strcmp (long_options[option_index].name, "density") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->density_arg), 
                 &(args_info->density_orig), &(args_info->density_given),
                &(local_args_info.density_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "density", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in x.  */
          else if (strcmp (long_options[option_index].name, "nx") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nx_arg), 
                 &(args_info->nx_orig), &(args_info->nx_given),
                &(local_args_info.nx_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nx", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in y.  */
          else if (strcmp (long_options[option_index].name, "ny") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->ny_arg), 
                 &(args_info->ny_orig), &(args_info->ny_given),
                &(local_args_info.ny_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "ny", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in z.  */
          else if (strcmp (long_options[option_index].name, "nz") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nz_arg), 
                 &(args_info->nz_orig), &(args_info->nz_given),
                &(local_args_info.nz_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nz", '-',
                additional_error))
              goto failure;
          
          }
          /* (Default) Builds a multi-component random mixed nanoparticle. Mole Fraction must be specified for each componet > 1 in MD file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}